

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  undefined7 uVar13;
  int *piVar14;
  int iVar15;
  byte *end;
  char *unaff_R12;
  Double *this_00;
  int len;
  byte *pbVar16;
  sbyte sVar17;
  byte bVar18;
  ulong uVar19;
  float fVar20;
  double dVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar22;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  byte *local_3b8;
  uint local_3ac;
  char *local_3a8;
  byte *local_3a0;
  int *local_398;
  int local_390;
  bool result_is_junk;
  double local_388;
  undefined8 uStack_380;
  uint local_378;
  int local_374;
  char *start;
  Vector<const_char> local_368;
  Vector<const_char> local_358;
  char buffer [782];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0017c25d:
    return this->empty_string_value_;
  }
  local_388 = (double)CONCAT44(local_388._4_4_,(int)CONCAT71(in_register_00000009,read_as_double));
  end = (byte *)(input + length);
  uVar3 = this->flags_;
  piVar14 = processed_characters_count;
  local_3b8 = (byte *)input;
  local_3ac = length;
  if ((uVar3 & 0x18) != 0) {
    bVar1 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)end);
    if (!bVar1) {
      *processed_characters_count = (int)local_3b8 - (int)input;
      goto LAB_0017c25d;
    }
    unaff_R12 = input;
    if (local_3b8 != (byte *)input && (char)((uVar3 & 8) >> 3) == '\0') goto LAB_0017c9e7;
  }
  bVar18 = *local_3b8;
  local_3a8 = input;
  if ((bVar18 == 0x2d) || (bVar18 == 0x2b)) {
    iVar15 = (int)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar18 == 0x2d);
    pbVar16 = local_3b8 + 1;
    buffer._0_8_ = pbVar16;
    bVar1 = AdvanceToNonspace<char_const*>((char **)buffer,(char *)end);
    if ((!bVar1) || (pbVar16 != (byte *)buffer._0_8_ && (char)((uVar3 & 0x20) >> 5) == '\0'))
    goto LAB_0017c9e7;
    local_3b8 = (byte *)buffer._0_8_;
    bVar18 = *(byte *)buffer._0_8_;
  }
  else {
    iVar15 = 0;
  }
  pbVar16 = (byte *)this->infinity_symbol_;
  bVar1 = SUB41(iVar15,0);
  if ((pbVar16 != (byte *)0x0) && (bVar18 == *pbVar16)) {
    bVar2 = ConsumeSubString<char_const*>((char **)&local_3b8,(char *)end,(char *)pbVar16);
    if (((bVar2) && (local_3b8 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)end), !bVar2)))) {
      *processed_characters_count = (int)local_3b8 - (int)local_3a8;
      if (bVar1 != false) {
        return -INFINITY;
      }
      return INFINITY;
    }
LAB_0017c338:
    return this->junk_string_value_;
  }
  pbVar16 = (byte *)this->nan_symbol_;
  if ((pbVar16 != (byte *)0x0) && (bVar18 == *pbVar16)) {
    bVar2 = ConsumeSubString<char_const*>((char **)&local_3b8,(char *)end,(char *)pbVar16);
    if (((bVar2) && (local_3b8 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)end), !bVar2)))) {
      *processed_characters_count = (int)local_3b8 - (int)local_3a8;
      if (bVar1 != false) {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_0017c338;
  }
  iVar6 = 0;
  if (bVar18 != 0x30) {
    uVar5 = 0;
LAB_0017c359:
    iVar15 = 0;
    uVar12 = 0;
    len = 0;
    pbVar16 = local_3b8;
    do {
      pbVar4 = pbVar16;
      uVar11 = (uint)uVar5;
      bVar10 = *pbVar4;
      piVar14 = (int *)CONCAT71((int7)((ulong)piVar14 >> 8),bVar10);
      iVar8 = (int)piVar14 + -0x30;
      if (9 < (byte)iVar8) {
        uVar19 = uVar5 & 0xff;
        if (iVar6 == 0) {
          uVar19 = 0;
        }
        iVar8 = 0;
        pbVar16 = pbVar4;
        if (bVar10 != 0x2e) goto LAB_0017c80b;
        if ((((byte)(uVar3 >> 2) & 0x3f | ~(byte)uVar19) & 1) == 0) goto LAB_0017c9e7;
        iVar8 = 0;
        local_398 = processed_characters_count;
        if ((uVar19 & 1) != 0) goto LAB_0017c3cd;
        pbVar16 = pbVar4 + 1;
        local_3b8 = pbVar16;
        if (pbVar16 != end) {
          iVar8 = 0;
          if (iVar6 != 0) goto LAB_0017c7b0;
          iVar8 = 0;
          goto LAB_0017c53e;
        }
        if (iVar6 == 0) {
          if (bVar18 == 0x30) goto LAB_0017c55e;
          goto LAB_0017c9e7;
        }
        break;
      }
      if (iVar6 < 0x304) {
        if (0x30d < len) {
          local_398 = processed_characters_count;
          __assert_fail("buffer_pos < kBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                        ,0x319,
                        "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                       );
        }
        lVar9 = (long)len;
        len = len + 1;
        buffer[lVar9] = bVar10;
        iVar6 = iVar6 + 1;
      }
      else {
        iVar15 = iVar15 + 1;
        uVar12 = CONCAT31((int3)((uint)iVar8 >> 8),bVar10 != 0x30 | (byte)uVar12);
      }
      if ((uVar5 & 1) == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = CONCAT71((int7)(uVar5 >> 8),(char)*pbVar4 < '8');
      }
      uVar11 = (uint)uVar5;
      pbVar16 = pbVar4 + 1;
    } while (pbVar4 + 1 != end);
    local_3b8 = pbVar4 + 1;
    iVar8 = 0;
    uVar19 = (ulong)uVar11;
    pbVar4 = local_3b8;
    local_398 = processed_characters_count;
    goto LAB_0017c3cd;
  }
  pbVar16 = local_3b8 + 1;
  if (pbVar16 == end) {
LAB_0017c4c7:
    *processed_characters_count = local_3ac;
LAB_0017c4cd:
    if (bVar1 == false) {
      return 0.0;
    }
    return -0.0;
  }
  if (((uVar3 & 1) == 0) || ((*pbVar16 | 0x20) != 0x78)) {
    do {
      if (*pbVar16 != 0x30) {
        uVar5 = (ulong)CONCAT31((int3)(uVar3 >> 8),(byte)uVar3 >> 1);
        local_3b8 = pbVar16;
        goto LAB_0017c359;
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != end);
    goto LAB_0017c4c7;
  }
  pbVar16 = local_3b8 + 2;
  if ((pbVar16 == end) ||
     (local_3b8 = pbVar16, local_3ac = uVar3, local_3a0 = end,
     bVar2 = isDigit((int)(char)*pbVar16,0x10), !bVar2)) goto LAB_0017c9e7;
  dVar21 = this->junk_string_value_;
  uVar22 = 0;
  do {
    if (*pbVar16 != 0x30) {
      sVar17 = 0x18;
      if (local_388._0_1_ != '\0') {
        sVar17 = 0x35;
      }
      this_00 = (Double *)0x0;
      uStack_380 = 0;
      iVar6 = 1;
      goto LAB_0017c67c;
    }
    pbVar16 = pbVar16 + 1;
  } while (pbVar16 != local_3a0);
  local_3b8 = pbVar16;
  if (bVar1 == false) {
    uVar22 = 0;
    local_388 = 0.0;
    goto LAB_0017c941;
  }
  goto LAB_0017c939;
LAB_0017c67c:
  bVar18 = *pbVar16;
  lVar9 = (long)(int)(char)bVar18;
  local_388 = dVar21;
  local_3b8 = pbVar16;
  local_390 = iVar15;
  if ((int)(char)bVar18 - 0x30U < 10) {
    lVar9 = lVar9 + -0x30;
  }
  else if ((byte)(bVar18 + 0x9f) < 6) {
    lVar9 = lVar9 + -0x57;
  }
  else {
    if (5 < (byte)(bVar18 + 0xbf)) {
      uVar3 = 0;
      uVar22 = 0;
      local_398 = processed_characters_count;
      if (((local_3ac & 4) == 0) &&
         (bVar1 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)local_3a0),
         uVar22 = uStack_380, bVar1)) {
        return local_388;
      }
      goto LAB_0017c8cb;
    }
    lVar9 = lVar9 + -0x37;
  }
  this_00 = (Double *)((long)this_00 * 0x10 + lVar9);
  uVar5 = (long)this_00 >> sVar17;
  if ((int)uVar5 == 0) goto code_r0x0017c6c3;
  local_374 = 0;
  for (; 1 < (int)(uint)uVar5; uVar5 = (ulong)((uint)uVar5 >> 1)) {
    iVar6 = iVar6 + 1;
    local_374 = local_374 + 1;
  }
  uVar5 = (long)this_00 >> ((byte)iVar6 & 0x3f);
  local_378 = (uint)this_00 & ~(-1 << ((byte)iVar6 & 0x1f));
  iVar6 = -iVar6;
  bVar18 = 1;
  local_398 = processed_characters_count;
  while (pbVar16 = pbVar16 + 1, pbVar16 != local_3a0) {
    bVar10 = *pbVar16;
    bVar1 = isDigit((int)(char)bVar10,0x10);
    uVar22 = extraout_XMM0_Qb;
    if (!bVar1) break;
    bVar18 = bVar18 & bVar10 == 0x30;
    iVar6 = iVar6 + -4;
  }
  local_3b8 = pbVar16;
  if (((local_3ac & 4) == 0) &&
     (bVar1 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)local_3a0),
     uVar22 = uStack_380, bVar1)) {
    return local_388;
  }
  uVar3 = 1 << ((byte)local_374 & 0x1f);
  if ((int)uVar3 < (int)local_378) {
    uVar5 = uVar5 + 1;
  }
  else if (local_378 == uVar3) {
    uVar5 = uVar5 + ((byte)(~bVar18 | (byte)uVar5) & 1);
  }
  bVar1 = (uVar5 >> sVar17 & 1) != 0;
  uVar3 = (uint)bVar1 - iVar6;
  this_00 = (Double *)((long)uVar5 >> bVar1);
  goto LAB_0017c8cb;
code_r0x0017c6c3:
  pbVar16 = pbVar16 + 1;
  if (pbVar16 == local_3a0) goto code_r0x0017c6cb;
  goto LAB_0017c67c;
LAB_0017c53e:
  local_3b8 = pbVar16;
  if (*pbVar16 != 0x30) goto LAB_0017c7b0;
  pbVar16 = pbVar16 + 1;
  if (pbVar16 == end) {
    *processed_characters_count = local_3ac;
    goto LAB_0017c4cd;
  }
  iVar8 = iVar8 + -1;
  goto LAB_0017c53e;
  while( true ) {
    if (iVar6 < 0x304) {
      if (0x30d < len) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      lVar9 = (long)len;
      len = len + 1;
      buffer[lVar9] = bVar10;
      iVar6 = iVar6 + 1;
      iVar8 = iVar8 + -1;
    }
    else {
      uVar5 = CONCAT71(uVar13,bVar10 != 0x30 | (byte)uVar12);
      uVar12 = (uint)uVar5;
    }
    pbVar16 = pbVar16 + 1;
    pbVar4 = pbVar16;
    if (pbVar16 == end) break;
LAB_0017c7b0:
    bVar10 = *pbVar16;
    uVar13 = (undefined7)(uVar5 >> 8);
    uVar5 = CONCAT71(uVar13,bVar10);
    if (9 < (byte)(bVar10 - 0x30)) goto LAB_0017c80b;
  }
  goto LAB_0017c3cd;
LAB_0017c80b:
  if (((bVar18 == 0x30) || (iVar8 != 0)) || (iVar6 != 0)) {
    local_3b8 = pbVar16;
    if ((*pbVar16 | 0x20) == 0x65) {
      if (((~(byte)uVar19 | (byte)(uVar3 >> 2) & 0x3f) & 1) == 0) goto LAB_0017c9e7;
      pbVar4 = pbVar16;
      local_398 = processed_characters_count;
      if ((uVar19 & 1) != 0) goto LAB_0017c3cd;
      local_3b8 = pbVar16 + 1;
      if ((local_3b8 == end) ||
         ((((bVar18 = *local_3b8, bVar18 == 0x2d || (bVar10 = 0x2b, bVar18 == 0x2b)) &&
           (local_3b8 = pbVar16 + 2, bVar10 = bVar18, local_3b8 == end)) ||
          ((local_3b8 == end || (bVar18 = *local_3b8, (byte)(bVar18 - 0x3a) < 0xf6)))))) {
        pbVar4 = local_3b8;
        if ((uVar3 & 4) == 0) goto LAB_0017c9e7;
        goto LAB_0017c3cd;
      }
      local_3ac = CONCAT31(local_3ac._1_3_,bVar10);
      if (0x3ffffffe < iVar8 + 0x1fffffffU) {
        __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x380,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      iVar6 = 0;
      do {
        local_3b8 = local_3b8 + 1;
        if ((iVar6 < 0x6666666) || ((iVar7 = 0x3fffffff, iVar6 == 0x6666666 && (bVar18 < 0x34)))) {
          iVar7 = iVar6 * 10 + (uint)bVar18 + -0x30;
        }
        iVar6 = iVar7;
      } while ((local_3b8 != end) && (bVar18 = *local_3b8, (byte)(bVar18 - 0x30) < 10));
      iVar7 = -iVar6;
      if (bVar10 != 0x2d) {
        iVar7 = iVar6;
      }
      iVar8 = iVar7 + iVar8;
    }
    if (((uVar3 & 0x14) != 0) || (local_3b8 == end)) {
      local_398 = processed_characters_count;
      if ((uVar3 & 4) == 0) {
        local_3a0 = (byte *)CONCAT44(local_3a0._4_4_,(int)uVar19);
        local_3ac = uVar12;
        local_390 = iVar15;
        bVar2 = AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)end);
        uVar19 = (ulong)local_3a0 & 0xffffffff;
        iVar15 = local_390;
        uVar12 = local_3ac;
        if (bVar2) goto LAB_0017c9e7;
      }
      pbVar4 = local_3b8;
      if ((uVar3 & 0x10) != 0) {
        local_3a0 = (byte *)CONCAT44(local_3a0._4_4_,(int)uVar19);
        local_3ac = uVar12;
        AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)end);
        uVar19 = (ulong)local_3a0 & 0xffffffff;
        uVar12 = local_3ac;
        pbVar4 = local_3b8;
      }
LAB_0017c3cd:
      local_3b8 = pbVar4;
      if ((uVar19 & 1) != 0) {
        start = buffer;
        dVar21 = RadixStringToIeee<3,char*>
                           (&start,buffer + len,bVar1,SUB41((uVar3 & 4) >> 2,0),
                            this->junk_string_value_,(bool)local_388._0_1_,&result_is_junk);
        if (result_is_junk != true) {
          *local_398 = (int)local_3b8 - (int)local_3a8;
          return dVar21;
        }
        __assert_fail("!result_is_junk",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x3a9,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                     );
      }
      iVar15 = iVar8 + iVar15;
LAB_0017c55e:
      if ((uVar12 & 1) != 0) {
        lVar9 = (long)len;
        len = len + 1;
        buffer[lVar9] = '1';
        iVar15 = iVar15 + -1;
      }
      if (len < 0x30e) {
        buffer[len] = '\0';
        if (local_388._0_1_ == '\0') {
          Vector<const_char>::Vector(&local_368,buffer,len);
          buffer_01.start_ = (ulong)(uint)local_368.length_;
          buffer_01.length_ = iVar15;
          buffer_01._12_4_ = 0;
          fVar20 = Strtof((double_conversion *)local_368.start_,buffer_01,uVar3);
          dVar21 = (double)fVar20;
        }
        else {
          Vector<const_char>::Vector(&local_358,buffer,len);
          buffer_00.start_ = (ulong)(uint)local_358.length_;
          buffer_00.length_ = iVar15;
          buffer_00._12_4_ = 0;
          dVar21 = Strtod((double_conversion *)local_358.start_,buffer_00,uVar3);
        }
        *local_398 = (int)local_3b8 - (int)local_3a8;
        if (bVar1 == false) {
          return dVar21;
        }
        return -dVar21;
      }
      __assert_fail("buffer_pos < kBufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x3b3,
                    "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const char *]"
                   );
    }
  }
LAB_0017c9e7:
  return this->junk_string_value_;
code_r0x0017c6cb:
  uVar3 = 0;
  uVar22 = 0;
  local_3b8 = pbVar16;
  local_398 = processed_characters_count;
LAB_0017c8cb:
  if (1L << sVar17 <= (long)this_00) {
    __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x273,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const char *]"
                 );
  }
  if (this_00 != (Double *)(long)(double)(long)this_00) {
    __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x274,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const char *]"
                 );
  }
  if (uVar3 != 0) {
    if (this_00 == (Double *)0x0) {
      __assert_fail("number != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x280,
                    "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const char *]"
                   );
    }
    diy_fp.f_ = (ulong)uVar3;
    diy_fp._8_8_ = local_3a8;
    local_388 = (double)Double::DiyFpToUint64(this_00,diy_fp);
    uVar22 = 0;
    processed_characters_count = local_398;
    goto LAB_0017c941;
  }
  processed_characters_count = local_398;
  local_388 = (double)(long)this_00;
  if ((char)local_390 == '\0') goto LAB_0017c941;
  if (this_00 != (Double *)0x0) {
    local_388 = (double)-(long)this_00;
    goto LAB_0017c941;
  }
LAB_0017c939:
  uVar22 = 0;
  local_388 = -0.0;
LAB_0017c941:
  iVar15 = (int)local_3a8;
  if ((local_3ac & 0x10) != 0) {
    uStack_380 = uVar22;
    AdvanceToNonspace<char_const*>((char **)&local_3b8,(char *)local_3a0);
    iVar15 = (int)local_3a8;
  }
  *processed_characters_count = (int)local_3b8 - iVar15;
  return local_388;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}